

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Vec_Int_t * Gia_ManComputeDistanceInt(Gia_Man_t *p,int iTarg,Vec_Int_t *vObjs,int fVerbose)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int *piVar4;
  int *piVar5;
  int Id;
  Vec_Int_t *p_00;
  Vec_Int_t *vRes;
  Vec_Int_t *p_01;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  Vec_Int_t t;
  
  p_00 = Vec_IntAlloc(100);
  vRes = Vec_IntAlloc(100);
  p_01 = Vec_IntStart(p->nObjs);
  Gia_ManIncrementTravId(p);
  if (vObjs == (Vec_Int_t *)0x0) {
    Gia_ObjSetTravIdCurrentId(p,iTarg);
    Vec_IntWriteEntry(p_01,iTarg,1);
    Vec_IntPush(p_00,iTarg);
  }
  else {
    for (iVar8 = 0; iVar8 < vObjs->nSize; iVar8 = iVar8 + 1) {
      Id = Vec_IntEntry(vObjs,iVar8);
      Gia_ObjSetTravIdCurrentId(p,Id);
      Vec_IntWriteEntry(p_01,Id,1);
      Vec_IntPush(p_00,Id);
    }
  }
  uVar9 = 0;
  while( true ) {
    if (fVerbose != 0) {
      uVar1 = p_01->nSize;
      uVar6 = 0;
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = (ulong)uVar1;
      }
      iVar8 = 0;
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        iVar8 = iVar8 + (uint)(p_01->pArray[uVar6] == 0);
      }
      printf("Ring %2d : %6d\n",uVar9,(ulong)(uVar1 - iVar8));
    }
    Gia_ManCollectRing(p,p_00,vRes,p_01);
    if (vRes->nSize == 0) break;
    p_00->nSize = 0;
    uVar2 = p_00->nCap;
    uVar3 = p_00->nSize;
    piVar4 = p_00->pArray;
    iVar8 = vRes->nSize;
    piVar5 = vRes->pArray;
    p_00->nCap = vRes->nCap;
    p_00->nSize = iVar8;
    p_00->pArray = piVar5;
    t.pArray._0_4_ = SUB84(piVar4,0);
    t.pArray._4_4_ = (undefined4)((ulong)piVar4 >> 0x20);
    vRes->nCap = uVar2;
    vRes->nSize = uVar3;
    *(undefined4 *)&vRes->pArray = t.pArray._0_4_;
    *(undefined4 *)((long)&vRes->pArray + 4) = t.pArray._4_4_;
    uVar9 = (ulong)((int)uVar9 + 1);
  }
  Vec_IntFree(p_00);
  Vec_IntFree(vRes);
  return p_01;
}

Assistant:

Vec_Int_t * Gia_ManComputeDistanceInt( Gia_Man_t * p, int iTarg, Vec_Int_t * vObjs, int fVerbose )
{
    int i, iObj;
    Vec_Int_t * vDists, * vStart, * vNexts;
    vStart = Vec_IntAlloc( 100 );
    vNexts = Vec_IntAlloc( 100 );
    vDists = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    if ( vObjs )
    {
        Vec_IntForEachEntry( vObjs, iObj, i )
        {
            Gia_ObjSetTravIdCurrentId(p, iObj);
            Vec_IntWriteEntry( vDists, iObj, 1 );
            Vec_IntPush( vStart, iObj );
        }
    }
    else
    {
        Gia_ObjSetTravIdCurrentId(p, iTarg);
        Vec_IntWriteEntry( vDists, iTarg, 1 );
        Vec_IntPush( vStart, iTarg );
    }
    for ( i = 0; ; i++ )
    {
        if ( fVerbose )
            printf( "Ring %2d : %6d\n", i, Vec_IntSize(vDists)-Vec_IntCountZero(vDists) );        
        Gia_ManCollectRing( p, vStart, vNexts, vDists );
        if ( Vec_IntSize(vNexts) == 0 )
            break;
        Vec_IntClear( vStart );
        ABC_SWAP( Vec_Int_t, *vStart, *vNexts );
    }
    Vec_IntFree( vStart );
    Vec_IntFree( vNexts );
    return vDists;
}